

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_set_layouts
          (Impl *this,Value *layouts,VkDescriptorSetLayout **out_layout)

{
  bool bVar1;
  SizeType SVar2;
  VkDescriptorSetLayout_T **ppVVar3;
  ConstValueIterator pGVar4;
  Ch *str;
  pointer ppVar5;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_false> local_58;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_false> local_50;
  iterator set_itr;
  uint64_t index;
  ConstValueIterator itr;
  VkDescriptorSetLayout_T **ret;
  VkDescriptorSetLayout_T **infos;
  VkDescriptorSetLayout **out_layout_local;
  Value *layouts_local;
  Impl *this_local;
  
  SVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(layouts);
  ppVVar3 = ScratchAllocator::allocate_n_cleared<VkDescriptorSetLayout_T*>
                      (&this->allocator,(ulong)SVar2);
  index = (uint64_t)
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Begin(layouts);
  ret = ppVVar3;
  do {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(layouts);
    if ((ConstValueIterator)index == pGVar4) {
      *out_layout = ppVVar3;
      return true;
    }
    str = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)index);
    set_itr.
    super__Node_iterator_base<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_false>.
    _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_false>)
             string_to_uint64(str);
    if (set_itr.
        super__Node_iterator_base<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_false>.
        _M_cur != (__node_type *)0x0) {
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_VkDescriptorSetLayout_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>_>
           ::find(&this->replayed_descriptor_set_layouts,(key_type *)&set_itr);
      local_58._M_cur =
           (__node_type *)
           std::
           end<std::unordered_map<unsigned_long,VkDescriptorSetLayout_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkDescriptorSetLayout_T*>>>>
                     (&this->replayed_descriptor_set_layouts);
      bVar1 = std::__detail::operator==(&local_50,&local_58);
      if (bVar1) {
        log_missing_resource
                  ("Descriptor set layout",
                   (Hash)set_itr.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_false>
                         ._M_cur);
        return false;
      }
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_false,_false>
                             *)&local_50);
      if (ppVar5->second == (VkDescriptorSetLayout_T *)0x0) {
        log_invalid_resource
                  ("Descriptor set layout",
                   (Hash)set_itr.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_false>
                         ._M_cur);
        return false;
      }
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_false,_false>
                             *)&local_50);
      *ret = ppVar5->second;
    }
    index = index + 0x10;
    ret = ret + 1;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_set_layouts(const Value &layouts, const VkDescriptorSetLayout **out_layout)
{
	auto *infos = allocator.allocate_n_cleared<VkDescriptorSetLayout>(layouts.Size());
	auto *ret = infos;

	for (auto itr = layouts.Begin(); itr != layouts.End(); ++itr, infos++)
	{
		auto index = string_to_uint64(itr->GetString());
		if (index > 0)
		{
			auto set_itr = replayed_descriptor_set_layouts.find(index);
			if (set_itr == end(replayed_descriptor_set_layouts))
			{
				log_missing_resource("Descriptor set layout", index);
				return false;
			}
			else if (set_itr->second == VK_NULL_HANDLE)
			{
				log_invalid_resource("Descriptor set layout", index);
				return false;
			}
			else
				*infos = set_itr->second;
		}
	}

	*out_layout = ret;
	return true;
}